

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O0

void do_cmd_wizard(void)

{
  _Bool _Var1;
  
  if ((player->noscore & 2) == 0) {
    msg("You are about to enter \'wizard\' mode for the very first time!");
    msg("This is a form of cheating, and your game will not be scored!");
    event_signal(EVENT_MESSAGE_FLUSH);
    _Var1 = get_check("Are you sure you want to enter wizard mode? ");
    if (!_Var1) {
      return;
    }
    player->noscore = player->noscore | 2;
  }
  if ((player->wizard & 1U) == 0) {
    player->wizard = true;
    msg("Wizard mode on.");
  }
  else {
    player->wizard = false;
    msg("Wizard mode off.");
  }
  player->upkeep->update = player->upkeep->update | 0x80;
  player->upkeep->redraw = player->upkeep->redraw | 2;
  return;
}

Assistant:

void do_cmd_wizard(void)
{
	/* Verify first time */
	if (!(player->noscore & NOSCORE_WIZARD)) {
		/* Mention effects */
		msg("You are about to enter 'wizard' mode for the very first time!");
		msg("This is a form of cheating, and your game will not be scored!");
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Verify request */
		if (!get_check("Are you sure you want to enter wizard mode? "))
			return;

		/* Mark savefile */
		player->noscore |= NOSCORE_WIZARD;
	}

	/* Toggle mode */
	if (player->wizard) {
		player->wizard = false;
		msg("Wizard mode off.");
	} else {
		player->wizard = true;
		msg("Wizard mode on.");
	}

	/* Update monsters */
	player->upkeep->update |= (PU_MONSTERS);

	/* Redraw "title" */
	player->upkeep->redraw |= (PR_TITLE);
}